

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  bool bVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  float *output;
  stbi_uc *__ptr;
  uint uVar9;
  long lVar10;
  uint c;
  int iVar11;
  uint a;
  char *pcVar12;
  uint uVar13;
  float *output_00;
  stbi_uc *psVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  char *local_498;
  float *local_490;
  stbi_uc *local_488;
  long local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  long local_460;
  ulong local_458;
  ulong local_450;
  long local_448;
  stbi_uc local_440;
  stbi_uc local_43f;
  stbi_uc local_43e;
  stbi_uc local_43d;
  stbi_uc local_43c [4];
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  iVar11 = req_comp;
  stbi__hdr_gettoken(s,&local_438);
  if ((CONCAT17(cStack_42e,
                CONCAT16(cStack_42f,
                         CONCAT15(cStack_430,
                                  CONCAT14(cStack_431,
                                           CONCAT13(cStack_432,
                                                    CONCAT12(cStack_433,
                                                             CONCAT11(cStack_434,cStack_435)))))))
       == 0x45434e41494441 &&
       CONCAT17(cStack_431,
                CONCAT16(cStack_432,
                         CONCAT15(cStack_433,
                                  CONCAT14(cStack_434,
                                           CONCAT13(cStack_435,
                                                    CONCAT12(cStack_436,
                                                             CONCAT11(cStack_437,local_438))))))) ==
       0x4e41494441523f23) ||
     (CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) == 0x454247 &&
      CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) == 0x47523f23)) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar1 = false;
      do {
        auVar15[0] = -(cStack_431 == '3');
        auVar15[1] = -(cStack_430 == '2');
        auVar15[2] = -(cStack_42f == '-');
        auVar15[3] = -(cStack_42e == 'b');
        auVar15[4] = -(cStack_42d == 'i');
        auVar15[5] = -(cStack_42c == 't');
        auVar15[6] = -(cStack_42b == '_');
        auVar15[7] = -(cStack_42a == 'r');
        auVar15[8] = -(cStack_429 == 'l');
        auVar15[9] = -(cStack_428 == 'e');
        auVar15[10] = -(cStack_427 == '_');
        auVar15[0xb] = -(cStack_426 == 'r');
        auVar15[0xc] = -(cStack_425 == 'g');
        auVar15[0xd] = -(cStack_424 == 'b');
        auVar15[0xe] = -(cStack_423 == 'e');
        auVar15[0xf] = -(cStack_422 == '\0');
        auVar16[0] = -(local_438 == 'F');
        auVar16[1] = -(cStack_437 == 'O');
        auVar16[2] = -(cStack_436 == 'R');
        auVar16[3] = -(cStack_435 == 'M');
        auVar16[4] = -(cStack_434 == 'A');
        auVar16[5] = -(cStack_433 == 'T');
        auVar16[6] = -(cStack_432 == '=');
        auVar16[7] = -(cStack_431 == '3');
        auVar16[8] = -(cStack_430 == '2');
        auVar16[9] = -(cStack_42f == '-');
        auVar16[10] = -(cStack_42e == 'b');
        auVar16[0xb] = -(cStack_42d == 'i');
        auVar16[0xc] = -(cStack_42c == 't');
        auVar16[0xd] = -(cStack_42b == '_');
        auVar16[0xe] = -(cStack_42a == 'r');
        auVar16[0xf] = -(cStack_429 == 'l');
        auVar16 = auVar16 & auVar15;
        if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if (bVar1) {
        local_498 = &local_438;
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d) {
          local_498 = &cStack_435;
          uVar7 = strtol(local_498,&local_498,10);
          local_498 = local_498 + -1;
          do {
            pcVar12 = local_498;
            local_498 = pcVar12 + 1;
          } while (pcVar12[1] == ' ');
          iVar6 = strncmp(local_498,"+X ",3);
          if (iVar6 == 0) {
            local_498 = pcVar12 + 4;
            uVar8 = strtol(local_498,(char **)0x0,10);
            a = (uint)uVar8;
            *x = a;
            uVar13 = (uint)uVar7;
            *y = uVar13;
            if (comp != (int *)0x0) {
              *comp = 3;
            }
            c = 3;
            if (req_comp != 0) {
              c = req_comp;
            }
            if (((int)(a | uVar13) < 0) ||
               ((((uVar13 != 0 && ((int)(0x7fffffff / (uVar7 & 0xffffffff)) < (int)a)) ||
                 (uVar9 = a * uVar13, (int)(uVar9 | c) < 0)) ||
                (((int)(0x7fffffff / (ulong)c) < (int)uVar9 || (0x1fffffff < uVar9 * c)))))) {
              stbi__g_failure_reason = "too large";
              return (float *)0x0;
            }
            output = (float *)stbi__malloc_mad4(a,uVar13,c,uVar9 * c,iVar11);
            if (output == (float *)0x0) {
LAB_0010a3cd:
              stbi__g_failure_reason = "outofmem";
              return (float *)0x0;
            }
            iVar11 = 0;
            local_478 = uVar7;
            if (a - 0x8000 < 0xffff8008) goto LAB_0010a3dc;
            if ((int)uVar13 < 1) {
              __ptr = (stbi_uc *)0x0;
            }
            else {
              local_450 = (ulong)(a * 4);
              local_468 = uVar7 & 0x7fffffff;
              local_470 = uVar8 & 0x7fffffff;
              local_460 = (uVar8 & 0xffffffff) * (long)(int)c * 4;
              local_448 = (long)(int)c << 2;
              uVar7 = 0;
              __ptr = (stbi_uc *)0x0;
              local_490 = output;
              do {
                local_458 = uVar7;
                sVar2 = stbi__get8(s);
                sVar3 = stbi__get8(s);
                sVar4 = stbi__get8(s);
                if (((sVar2 != '\x02') || (sVar3 != '\x02')) || ((char)sVar4 < '\0')) {
                  local_440 = sVar2;
                  local_43f = sVar3;
                  local_43e = sVar4;
                  local_43d = stbi__get8(s);
                  stbi__hdr_convert(output,&local_440,c);
                  free(__ptr);
                  iVar11 = 0;
                  iVar6 = 1;
                  do {
                    stbi__getn(s,local_43c,4);
                    stbi__hdr_convert(output + (long)(int)(c * a * iVar11) + (long)(int)(iVar6 * c),
                                      local_43c,c);
                    iVar6 = iVar6 + 1;
                    while ((int)a <= iVar6) {
                      iVar11 = iVar11 + 1;
LAB_0010a3dc:
                      iVar6 = 0;
                      if ((int)local_478 <= iVar11) {
                        return output;
                      }
                    }
                  } while( true );
                }
                sVar2 = stbi__get8(s);
                if (CONCAT11(sVar4,sVar2) != a) {
                  free(output);
                  free(__ptr);
                  stbi__g_failure_reason = "invalid decoded scanline length";
                  return (float *)0x0;
                }
                if (__ptr == (stbi_uc *)0x0) {
                  if ((int)a < 0x20000000) {
                    __ptr = (stbi_uc *)malloc(local_450);
                  }
                  else {
                    __ptr = (stbi_uc *)0x0;
                  }
                  if (__ptr == (stbi_uc *)0x0) {
                    free(output);
                    goto LAB_0010a3cd;
                  }
                }
                local_480 = 0;
                local_488 = __ptr;
                do {
                  if (0 < (int)a) {
                    iVar11 = 0;
                    uVar7 = uVar8 & 0xffffffff;
                    do {
                      bVar5 = stbi__get8(s);
                      psVar14 = local_488;
                      if (bVar5 < 0x81) {
                        uVar13 = (uint)bVar5;
                        if ((uint)uVar7 < uVar13) goto LAB_0010a336;
                        if (uVar13 != 0) {
                          lVar10 = 0;
                          do {
                            sVar2 = stbi__get8(s);
                            psVar14[lVar10 * 4 + (long)iVar11 * 4] = sVar2;
                            lVar10 = lVar10 + 1;
                          } while (uVar13 != (uint)lVar10);
                          iVar11 = iVar11 + (uint)lVar10;
                        }
                      }
                      else {
                        sVar2 = stbi__get8(s);
                        if ((uint)uVar7 < (bVar5 & 0x7f)) {
LAB_0010a336:
                          free(output);
                          free(__ptr);
                          stbi__g_failure_reason = "corrupt";
                          return (float *)0x0;
                        }
                        if ((bVar5 & 0x7f) != 0) {
                          lVar10 = 0;
                          do {
                            local_488[lVar10 * 4 + (long)iVar11 * 4] = sVar2;
                            lVar10 = lVar10 + 1;
                          } while ((bVar5 & 0x7f) != (uint)lVar10);
                          iVar11 = iVar11 + (uint)lVar10;
                        }
                      }
                      uVar7 = (ulong)(a - iVar11);
                    } while (a - iVar11 != 0 && iVar11 <= (int)a);
                  }
                  local_480 = local_480 + 1;
                  local_488 = local_488 + 1;
                } while (local_480 != 4);
                local_480 = 4;
                uVar7 = local_470;
                output_00 = local_490;
                psVar14 = __ptr;
                if (0 < (int)a) {
                  do {
                    stbi__hdr_convert(output_00,psVar14,c);
                    output_00 = (float *)((long)output_00 + local_448);
                    psVar14 = psVar14 + 4;
                    uVar7 = uVar7 - 1;
                  } while (uVar7 != 0);
                }
                uVar7 = local_458 + 1;
                local_490 = (float *)((long)local_490 + local_460);
              } while (uVar7 != local_468);
            }
            if (__ptr != (stbi_uc *)0x0) {
              free(__ptr);
              return output;
            }
            return output;
          }
        }
        stbi__g_failure_reason = "unsupported data layout";
        return (float *)0x0;
      }
    }
    stbi__g_failure_reason = "unsupported format";
  }
  else {
    stbi__g_failure_reason = "not HDR";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}